

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  double value;
  bool value_00;
  int iVar1;
  int iVar2;
  int32_t value_01;
  uint32_t value_02;
  LogMessage *other_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *pFVar3;
  Message *pMVar4;
  Message *pMVar5;
  uint64_t value_03;
  int64_t value_04;
  string *value_05;
  MapValueRef *map_val;
  float value_06;
  const_iterator other_it;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_98;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_78;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
       ).super_MapFieldBase.state_._M_i == STATE_MODIFIED_REPEATED) ||
     ((other->state_)._M_i == STATE_MODIFIED_REPEATED)) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,0x165);
    other_00 = LogMessage::operator<<
                         (&local_68,"CHECK failed: IsMapValid() && other.IsMapValid(): ");
    LogFinisher::operator=((LogFinisher *)&local_98,other_00);
    LogMessage::~LogMessage(&local_68);
  }
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])(this);
  local_68.filename_ = (char *)(other + 1);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::SearchFrom((iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
                *)&local_68,other[1].mutex_.mu_.super___mutex_base._M_mutex.__align);
  local_98.bucket_index_ = local_68._16_8_;
  local_98.node_ = (Node *)local_68._0_8_;
  local_98.m_ = (InnerMap *)local_68.filename_;
  if ((Node *)local_68._0_8_ != (Node *)0x0) {
    local_78 = &this->map_;
    do {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      FindHelper<google::protobuf::MapKey>
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
                  *)&local_68,(InnerMap *)CONCAT44(extraout_var,iVar1),(MapKey *)local_98.node_,
                 (TreeIterator *)0x0);
      if ((Node *)local_68._0_8_ == (Node *)0x0) {
        Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
        insert<google::protobuf::MapKey_const&>
                  ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
                    *)&local_68,local_78,(MapKey *)local_98.node_);
        map_val = (MapValueRef *)(local_68._0_8_ + 0x28);
        AllocateMapValue(this,map_val);
      }
      else {
        map_val = (MapValueRef *)(local_68._0_8_ + 0x28);
      }
      iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
      pFVar3 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar2));
      if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
        local_68._0_8_ = FieldDescriptor::TypeOnceInit;
        local_70 = pFVar3;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                   &local_70);
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4)) {
      case 1:
        value_01 = MapValueConstRef::GetInt32Value
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetInt32Value(map_val,value_01);
        break;
      case 2:
        value_04 = MapValueConstRef::GetInt64Value
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetInt64Value(map_val,value_04);
        break;
      case 3:
        value_02 = MapValueConstRef::GetUInt32Value
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetUInt32Value(map_val,value_02);
        break;
      case 4:
        value_03 = MapValueConstRef::GetUInt64Value
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetUInt64Value(map_val,value_03);
        break;
      case 5:
        value = MapValueConstRef::GetDoubleValue((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetDoubleValue(map_val,value);
        break;
      case 6:
        value_06 = MapValueConstRef::GetFloatValue
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetFloatValue(map_val,value_06);
        break;
      case 7:
        value_00 = MapValueConstRef::GetBoolValue((MapValueConstRef *)&(local_98.node_)->field_0x28)
        ;
        MapValueRef::SetBoolValue(map_val,value_00);
        break;
      case 8:
        iVar2 = MapValueConstRef::GetEnumValue((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetEnumValue(map_val,iVar2);
        break;
      case 9:
        value_05 = MapValueConstRef::GetStringValue_abi_cxx11_
                             ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        MapValueRef::SetStringValue(map_val,value_05);
        break;
      case 10:
        pMVar4 = MapValueRef::MutableMessageValue(map_val);
        pMVar5 = MapValueConstRef::GetMessageValue
                           ((MapValueConstRef *)&(local_98.node_)->field_0x28);
        (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xd])(pMVar4,pMVar5);
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
      ::operator++(&local_98);
    } while (local_98.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->map_value();
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}